

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> cont)

{
  ulong uVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  size_t sVar3;
  iterator pMVar4;
  iterator o;
  __mpz_struct local_60;
  __mpz_struct local_50;
  uint local_40;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_38;
  
  sVar3 = cont._M_len;
  o = cont._M_array;
  this->_capacity = sVar3;
  if (sVar3 == 0) {
    this->_stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    this->_cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    this->_end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  }
  else {
    uVar1 = sVar3 * 0x30;
    if (uVar1 == 0) {
      pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar1 < 0x11) {
      pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar1 < 0x19) {
      pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar1 < 0x21) {
      pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar1 < 0x31) {
      pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar1 < 0x41) {
      pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)::operator_new(uVar1,0x10)
      ;
    }
    this->_stack = pMVar2;
    this->_cursor = pMVar2;
    this->_end = pMVar2 + this->_capacity;
    pMVar4 = o + sVar3;
    do {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_60,(IntegerConstantType *)o);
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_50,&(o->numeral)._den);
      local_40 = (o->factors)._id;
      local_38 = (o->factors)._ptr;
      pMVar2 = this->_cursor;
      if (pMVar2 == this->_end) {
        expand(this);
        pMVar2 = this->_cursor;
      }
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)pMVar2,(IntegerConstantType *)&local_60);
      Kernel::IntegerConstantType::IntegerConstantType
                (&(pMVar2->numeral)._den,(IntegerConstantType *)&local_50);
      (pMVar2->factors)._id = local_40;
      (pMVar2->factors)._ptr = local_38;
      this->_cursor = this->_cursor + 1;
      mpz_clear(&local_50);
      mpz_clear(&local_60);
      o = o + 1;
    } while (o != pMVar4);
  }
  return;
}

Assistant:

Stack(std::initializer_list<C> cont)
   : Stack(cont.size())
  {
    for (auto const& x : cont) {
      push(x);
    }
  }